

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O1

assetsys_error_t
assetsys_mount(assetsys_t *sys,char *path,char *zip_mem,size_t zip_mem_size,char *mount_as)

{
  mz_zip_archive *pZip;
  strpool_t *pool;
  mz_uint mVar1;
  assetsys_internal_mount_t *paVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  mz_bool mVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  assetsys_internal_mount_t *paVar10;
  unsigned_long_long uVar11;
  assetsys_internal_file_t *paVar12;
  assetsys_internal_folder_t *paVar13;
  strpool_internal_entry_t *psVar14;
  assetsys_internal_mount_type_t aVar15;
  assetsys_error_t aVar16;
  mz_uint mVar17;
  long lVar18;
  char *path_00;
  long lVar19;
  stat s;
  mz_zip_archive_file_stat local_438;
  
  aVar16 = ASSETSYS_ERROR_INVALID_PARAMETER;
  if (mount_as != (char *)0x0 && path != (char *)0x0) {
    pcVar8 = strchr(path,0x5c);
    aVar16 = ASSETSYS_ERROR_INVALID_PATH;
    if (((pcVar8 == (char *)0x0) && (pcVar8 = strchr(mount_as,0x3a), pcVar8 == (char *)0x0)) &&
       (pcVar8 = strchr(mount_as,0x5c), pcVar8 == (char *)0x0)) {
      sVar9 = strlen(path);
      iVar5 = (int)sVar9;
      if (((iVar5 < 1) || (*path != '/')) && ((iVar5 < 2 || (path[iVar5 - 1] != '/')))) {
        sVar9 = strlen(mount_as);
        iVar5 = (int)sVar9;
        if (((iVar5 != 0) && (*mount_as == '/')) && ((iVar5 < 2 || (mount_as[iVar5 - 1] != '/')))) {
          aVar15 = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
          if (zip_mem == (char *)0x0) {
            pcVar8 = ".";
            if (*path != '\0') {
              pcVar8 = path;
            }
            iVar5 = stat(pcVar8,(stat *)&local_438);
            aVar15 = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
            if (iVar5 == 0) {
              cVar4 = '\x01';
              if ((local_438.m_crc32 >> 0xe & 1) == 0) {
                cVar4 = (char)((local_438.m_crc32 & 0xffff) >> 0xf);
                aVar15 = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
              }
            }
            else {
              cVar4 = '\0';
            }
            if (cVar4 == '\0') {
              return ASSETSYS_ERROR_INVALID_PATH;
            }
          }
          iVar5 = sys->mounts_count;
          iVar7 = sys->mounts_capacity;
          if (iVar7 <= iVar5) {
            sys->mounts_capacity = iVar7 * 2;
            paVar10 = (assetsys_internal_mount_t *)malloc((long)iVar7 * 0x130);
            paVar2 = sys->mounts;
            memcpy(paVar10,paVar2,(long)iVar5 * 0x98);
            free(paVar2);
            sys->mounts = paVar10;
          }
          paVar10 = sys->mounts;
          iVar5 = sys->mounts_count;
          paVar2 = paVar10 + iVar5;
          uVar11 = assetsys_internal_add_string(sys,mount_as);
          paVar10[iVar5].mounted_as = uVar11;
          sVar9 = strlen(mount_as);
          paVar10[iVar5].mount_len = (int)sVar9;
          uVar11 = assetsys_internal_add_string(sys,path);
          paVar10[iVar5].path = uVar11;
          paVar10[iVar5].type = aVar15;
          paVar10[iVar5].files_count = 0;
          paVar10[iVar5].files_capacity = 0x1000;
          paVar12 = (assetsys_internal_file_t *)malloc(0xc000);
          paVar10[iVar5].files = paVar12;
          paVar10[iVar5].dirs_count = 0;
          paVar10[iVar5].dirs_capacity = 0x400;
          paVar13 = (assetsys_internal_folder_t *)malloc(0x1000);
          paVar10[iVar5].dirs = paVar13;
          paVar10[iVar5].dirs_count = 1;
          iVar5 = assetsys_internal_register_collated(sys,mount_as,0);
          paVar13->collated_index = iVar5;
          if (aVar15 == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR) {
            assetsys_internal_recurse_directories(sys,iVar5,paVar2);
          }
          else {
            pZip = &paVar2->zip;
            (paVar2->zip).m_pAlloc = (mz_alloc_func)0x0;
            (paVar2->zip).m_pFree = (mz_free_func)0x0;
            (paVar2->zip).m_pRealloc = (mz_realloc_func)0x0;
            (paVar2->zip).m_pAlloc_opaque = (void *)0x0;
            (paVar2->zip).m_pIO_opaque = (void *)0x0;
            (paVar2->zip).m_pState = (mz_zip_internal_state *)0x0;
            (paVar2->zip).m_pRead = (mz_file_read_func)0x0;
            (paVar2->zip).m_pWrite = (mz_file_write_func)0x0;
            (paVar2->zip).m_total_files = 0;
            (paVar2->zip).m_zip_mode = MZ_ZIP_MODE_INVALID;
            *(undefined8 *)&(paVar2->zip).m_file_offset_alignment = 0;
            (paVar2->zip).m_archive_size = 0;
            (paVar2->zip).m_central_directory_file_ofs = 0;
            (paVar2->zip).m_pAlloc = assetsys_internal_mz_alloc;
            (paVar2->zip).m_pRealloc = assetsys_internal_mz_realloc;
            (paVar2->zip).m_pFree = assetsys_internal_mz_free;
            (paVar2->zip).m_pAlloc_opaque = sys->memctx;
            mVar6 = mz_zip_reader_init_mem(pZip,zip_mem,zip_mem_size,0);
            if (mVar6 == 0) {
              free(paVar2->dirs);
              free(paVar2->files);
              aVar16 = ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
LAB_001503b0:
              bVar3 = false;
            }
            else {
              mVar1 = (paVar2->zip).m_total_files;
              if (0 < (int)mVar1) {
                pcVar8 = sys->temp;
                mVar17 = 0;
                do {
                  mVar6 = mz_zip_reader_is_file_a_directory(pZip,mVar17);
                  if (mVar6 != 0) {
                    iVar5 = paVar2->dirs_count;
                    iVar7 = paVar2->dirs_capacity;
                    if (iVar7 <= iVar5) {
                      paVar2->dirs_capacity = iVar7 * 2;
                      paVar13 = (assetsys_internal_folder_t *)malloc((long)iVar7 << 3);
                      memcpy(paVar13,paVar2->dirs,(long)iVar5 << 2);
                      free(paVar2->dirs);
                      paVar2->dirs = paVar13;
                    }
                    mz_zip_reader_get_filename(pZip,mVar17,(char *)&local_438,0x400);
                    paVar13 = paVar2->dirs;
                    iVar5 = paVar2->dirs_count;
                    paVar2->dirs_count = iVar5 + 1;
                    psVar14 = strpool_internal_get_entry(&sys->strpool,paVar2->mounted_as);
                    strcpy(pcVar8,psVar14->data + 8);
                    sVar9 = strlen(pcVar8);
                    (sys->temp + sVar9)[0] = '/';
                    (sys->temp + sVar9)[1] = '\0';
                    strcat(pcVar8,(char *)&local_438);
                    sVar9 = strlen(pcVar8);
                    sys->temp[sVar9 - 1] = '\0';
                    iVar7 = assetsys_internal_register_collated(sys,pcVar8,0);
                    paVar13[iVar5].collated_index = iVar7;
                  }
                  mVar17 = mVar17 + 1;
                } while (mVar1 != mVar17);
              }
              bVar3 = (int)mVar1 < 1;
              if ((int)mVar1 < 1) {
                aVar16 = ASSETSYS_ERROR_INVALID_PATH;
              }
              else {
                pcVar8 = sys->temp;
                pool = &sys->strpool;
                mVar17 = 0;
                aVar16 = ASSETSYS_ERROR_INVALID_PATH;
                do {
                  mVar6 = mz_zip_reader_is_file_a_directory(pZip,mVar17);
                  if (mVar6 == 0) {
                    iVar5 = paVar2->files_count;
                    iVar7 = paVar2->files_capacity;
                    if (iVar7 <= iVar5) {
                      paVar2->files_capacity = iVar7 * 2;
                      paVar12 = (assetsys_internal_file_t *)malloc((long)iVar7 * 0x18);
                      memcpy(paVar12,paVar2->files,(long)iVar5 * 0xc);
                      free(paVar2->files);
                      paVar2->files = paVar12;
                    }
                    mVar6 = mz_zip_reader_file_stat(pZip,mVar17,&local_438);
                    if (mVar6 == 0) {
                      mz_zip_reader_end(pZip);
                      free(paVar2->dirs);
                      free(paVar2->files);
                      aVar16 = ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                    }
                    else {
                      paVar12 = paVar2->files;
                      iVar5 = paVar2->files_count;
                      paVar2->files_count = iVar5 + 1;
                      psVar14 = strpool_internal_get_entry(pool,paVar2->mounted_as);
                      strcpy(pcVar8,psVar14->data + 8);
                      sVar9 = strlen(pcVar8);
                      (sys->temp + sVar9)[0] = '/';
                      (sys->temp + sVar9)[1] = '\0';
                      strcat(pcVar8,local_438.m_filename);
                      iVar7 = assetsys_internal_register_collated(sys,pcVar8,1);
                      paVar12[iVar5].collated_index = iVar7;
                      paVar12[iVar5].size = (int)local_438.m_uncomp_size;
                      paVar12[iVar5].zip_index = mVar17;
                      assetsys_internal_dirname(pcVar8);
                      sVar9 = strlen(assetsys_internal_dirname::result);
                      uVar11 = strpool_inject(pool,assetsys_internal_dirname::result,(int)sVar9 + -1
                                             );
                      lVar19 = (long)paVar2->dirs_count;
                      if (0 < lVar19) {
                        lVar18 = 0;
                        bVar3 = false;
                        do {
                          if (uVar11 == sys->collated[paVar2->dirs[lVar18].collated_index].path) {
                            bVar3 = true;
                          }
                          lVar18 = lVar18 + 1;
                        } while (lVar19 != lVar18);
                        if (bVar3) goto LAB_00150366;
                      }
                      paVar13 = paVar2->dirs;
                      paVar2->dirs_count = paVar2->dirs_count + 1;
                      psVar14 = strpool_internal_get_entry(pool,uVar11);
                      if (psVar14 == (strpool_internal_entry_t *)0x0) {
                        path_00 = (char *)0x0;
                      }
                      else {
                        path_00 = psVar14->data + 8;
                      }
                      iVar5 = assetsys_internal_register_collated(sys,path_00,0);
                      paVar13[lVar19].collated_index = iVar5;
                    }
LAB_00150366:
                    if (mVar6 == 0) goto LAB_001503b0;
                  }
                  mVar17 = mVar17 + 1;
                } while (mVar17 != mVar1);
                bVar3 = true;
              }
            }
            if (!bVar3) {
              return aVar16;
            }
          }
          assetsys_internal_collate_directories(sys,paVar2);
          sys->mounts_count = sys->mounts_count + 1;
          aVar16 = ASSETSYS_SUCCESS;
        }
      }
    }
  }
  return aVar16;
}

Assistant:

assetsys_error_t assetsys_mount( assetsys_t* sys, char const* path, const char *zip_mem, size_t zip_mem_size, char const* mount_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mount_as ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( strchr( path, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, ':' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    if( strchr( mount_as, '\\' ) ) return ASSETSYS_ERROR_INVALID_PATH;
    int len = (int) strlen( path );
    if( len > 0 && path[ 0 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;       
    if( len > 1 && path[ len - 1 ] == '/' ) return ASSETSYS_ERROR_INVALID_PATH;     
    int mount_len = (int) strlen( mount_as );
    if( mount_len == 0 || mount_as[ 0 ] != '/' || ( mount_len > 1 && mount_as[ mount_len - 1 ] == '/' ) ) 
        return ASSETSYS_ERROR_INVALID_PATH;     
    
    enum assetsys_internal_mount_type_t type;

    if (!zip_mem) 
    {
    #if defined( _MSC_VER ) && _MSC_VER >= 1400
        struct _stat64 s;
        int res = __stat64( *path == '\0' ? "." : path, &s );
    #else
        struct stat s;
        int res = stat( *path == '\0' ? "." : path, &s );
    #endif
    if( res == 0 )
        {
        if( s.st_mode & S_IFDIR ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_DIR;
        else if( s.st_mode & S_IFREG ) type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
        else return ASSETSYS_ERROR_INVALID_PATH;
        }
    else
        {
        return ASSETSYS_ERROR_INVALID_PATH;
        }
    }
    else 
    {
        type = ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP;
    }

    if( sys->mounts_count >= sys->mounts_capacity )
        {
        sys->mounts_capacity *= 2;
        struct assetsys_internal_mount_t* new_mounts = (struct assetsys_internal_mount_t*) ASSETSYS_MALLOC( sys->memctx, 
            sizeof( *sys->mounts ) * sys->mounts_capacity );
        memcpy( new_mounts, sys->mounts, sizeof( *sys->mounts ) * sys->mounts_count );
        ASSETSYS_FREE( sys->memctx, sys->mounts );
        sys->mounts = new_mounts;
        }

    struct assetsys_internal_mount_t* mount = &sys->mounts[ sys->mounts_count ];

    mount->mounted_as = assetsys_internal_add_string( sys, mount_as ? mount_as : "" );
    mount->mount_len = mount_as ? (int) strlen( mount_as ) : 0;
    mount->path = assetsys_internal_add_string( sys, path );
    mount->type = type;
        
    mount->files_count = 0;
    mount->files_capacity = 4096;
    mount->files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->files) ) * mount->files_capacity );

    mount->dirs_count = 0;
    mount->dirs_capacity = 1024;
    mount->dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( sys->memctx, 
        sizeof( *(mount->dirs) ) * mount->dirs_capacity );

    struct assetsys_internal_folder_t* dir = &mount->dirs[ mount->dirs_count++ ];
    dir->collated_index = assetsys_internal_register_collated( sys, mount_as, 0 );
    
    if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_DIR )
        {
        assetsys_internal_recurse_directories( sys, dir->collated_index, mount );
        }
    else if( type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP )
        {
        memset( &mount->zip, 0, sizeof( mount->zip ) );
        mount->zip.m_pAlloc = assetsys_internal_mz_alloc;
        mount->zip.m_pRealloc = assetsys_internal_mz_realloc;
        mount->zip.m_pFree = assetsys_internal_mz_free;
        mount->zip.m_pAlloc_opaque = sys->memctx;
        //mz_bool status = mz_zip_reader_init_file( &mount->zip, path, 0 );
        mz_bool status = mz_zip_reader_init_mem( &mount->zip, zip_mem, zip_mem_size, 0 );
        if( !status )
            {
            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );
            return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
            }

        int count = (int) mz_zip_reader_get_num_files( &mount->zip );

        for( int i = 0; i < count; ++i )
            {
            if( mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->dirs_count >= mount->dirs_capacity )
                    {
                    mount->dirs_capacity *= 2;
                    struct assetsys_internal_folder_t* new_dirs = (struct assetsys_internal_folder_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->dirs) ) * mount->dirs_capacity );
                    memcpy( new_dirs, mount->dirs, sizeof( *(mount->dirs) ) * mount->dirs_count );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    mount->dirs = new_dirs;
                    }

                char filename[ 1024 ];                
                mz_zip_reader_get_filename( &mount->zip, (mz_uint) i, filename, sizeof( filename ) );

                struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, filename );
                sys->temp[ strlen( sys->temp )  - 1 ] = '\0';
                as_dir->collated_index = assetsys_internal_register_collated( sys, sys->temp, 0 );
                }
            }

        for( int i = 0; i < count; ++i )
            {
            if( !mz_zip_reader_is_file_a_directory( &mount->zip, (mz_uint) i ) )
                {
                if( mount->files_count >= mount->files_capacity )
                    {
                    mount->files_capacity *= 2;
                    struct assetsys_internal_file_t* new_files = (struct assetsys_internal_file_t*) ASSETSYS_MALLOC( 
                        sys->memctx, sizeof( *(mount->files) ) * mount->files_capacity );
                    memcpy( new_files, mount->files, sizeof( *(mount->files) ) * mount->files_count );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    mount->files = new_files;
                    }

                mz_zip_archive_file_stat stat;
                mz_bool result = mz_zip_reader_file_stat( &mount->zip, (mz_uint) i, &stat);
                if( !result )
                    {
                    mz_zip_reader_end( &mount->zip );
                    ASSETSYS_FREE( sys->memctx, mount->dirs );
                    ASSETSYS_FREE( sys->memctx, mount->files );
                    return ASSETSYS_ERROR_FAILED_TO_READ_ZIP;
                    }

                struct assetsys_internal_file_t* file = &mount->files[ mount->files_count++ ];
                strcpy( sys->temp, assetsys_internal_get_string( sys, mount->mounted_as ) );
                strcat( sys->temp, "/" );
                strcat( sys->temp, stat.m_filename );
                file->collated_index = assetsys_internal_register_collated( sys, sys->temp, 1 );
                file->size = (int) stat.m_uncomp_size;
                file->zip_index = i;

                char* dir_path = assetsys_internal_dirname( sys->temp );
                ASSETSYS_U64 handle = strpool_inject( &sys->strpool, dir_path, (int) strlen( dir_path ) - 1 );               
                int found = 0;
                for( int j = 0; j < mount->dirs_count; ++j )
                    {
                    if( handle == sys->collated[ mount->dirs[ j ].collated_index ].path )
                        found = 1;
                    }
                if( !found ) 
                    {
                    struct assetsys_internal_folder_t* as_dir = &mount->dirs[ mount->dirs_count++ ];
                    as_dir->collated_index = assetsys_internal_register_collated( sys, 
                        assetsys_internal_get_string( sys, handle ), 0 );
                    }
                }
            }
        }
        

    assetsys_internal_collate_directories( sys, mount );

    ++sys->mounts_count;
    return ASSETSYS_SUCCESS;
    }